

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

void chrono::Q_to_AngAxis(ChQuaternion<double> *quat,double *angle,ChVector<double> *axis)

{
  undefined1 auVar1 [16];
  double __x;
  undefined1 auVar2 [16];
  ChVector<double> local_58;
  ChVector<double> local_38;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = quat->m_data[0];
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar1 = vandpd_avx512vl(auVar2,auVar1);
  if (0.99999999 <= auVar1._0_8_) {
    axis->m_data[0] = 1.0;
    axis->m_data[1] = 0.0;
    axis->m_data[2] = 0.0;
    *angle = 0.0;
  }
  else {
    __x = acos(quat->m_data[0]);
    local_38.m_data[2] = sin(__x);
    local_38.m_data[2] = 1.0 / local_38.m_data[2];
    local_38.m_data[0] = local_38.m_data[2] * quat->m_data[1];
    local_38.m_data[1] = local_38.m_data[2] * quat->m_data[2];
    local_38.m_data[2] = local_38.m_data[2] * quat->m_data[3];
    *angle = __x + __x;
    Vnorm<double>(&local_58,&local_38);
    if (&local_58 != axis) {
      axis->m_data[0] = local_58.m_data[0];
      axis->m_data[1] = local_58.m_data[1];
      axis->m_data[2] = local_58.m_data[2];
    }
  }
  return;
}

Assistant:

void Q_to_AngAxis(const ChQuaternion<double>& quat, double& angle, ChVector<double>& axis) {
    if (std::abs(quat.e0()) < 0.99999999) {
        double arg = acos(quat.e0());
        double invsine = 1 / sin(arg);
        ChVector<double> vtemp;
        vtemp.x() = invsine * quat.e1();
        vtemp.y() = invsine * quat.e2();
        vtemp.z() = invsine * quat.e3();
        angle = 2 * arg;
        axis = Vnorm(vtemp);
    } else {
        axis.x() = 1;
        axis.y() = 0;
        axis.z() = 0;
        angle = 0;
    }
}